

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.h
# Opt level: O2

void __thiscall HevcSpsUnit::HevcSpsUnit(HevcSpsUnit *this)

{
  (this->super_HevcUnitWithProfile).super_HevcUnit.nal_unit_type = TRAIL_N;
  (this->super_HevcUnitWithProfile).super_HevcUnit.nuh_layer_id = '\0';
  (this->super_HevcUnitWithProfile).super_HevcUnit.nuh_temporal_id_plus1 = '\0';
  (this->super_HevcUnitWithProfile).super_HevcUnit.m_nalBuffer = (uint8_t *)0x0;
  (this->super_HevcUnitWithProfile).super_HevcUnit.m_nalBufferLen = 0;
  (this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.super_BitStream.m_totalBits = 0;
  (this->num_delta_pocs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_delta_pocs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_delta_pocs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.super_BitStream.m_buffer = (uint *)0x0;
  (this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.super_BitStream.m_initBuffer =
       (uint *)0x0;
  *(undefined8 *)
   ((long)&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.super_BitStream.m_initBuffer +
   5) = 0;
  *(undefined8 *)((long)&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader.m_bitLeft + 1) =
       0;
  this->sps_id = 0;
  this->chromaFormat = 0;
  this->separate_colour_plane_flag = false;
  this->pic_width_in_luma_samples = 0;
  this->pic_height_in_luma_samples = 0;
  this->bit_depth_luma_minus8 = 0;
  this->bit_depth_chroma_minus8 = 0;
  *(undefined8 *)((long)&this->bit_depth_chroma_minus8 + 3) = 0;
  this->colour_primaries = '\x02';
  this->transfer_characteristics = '\x02';
  this->matrix_coeffs = '\x02';
  this->chroma_sample_loc_type_top_field = 0;
  this->chroma_sample_loc_type_bottom_field = 0;
  this->num_short_term_ref_pic_sets = 0;
  this->num_units_in_tick = 0;
  this->time_scale = 0;
  this->PicSizeInCtbsY_bits = 0;
  return;
}

Assistant:

HevcUnit() : nal_unit_type(), nuh_layer_id(0), nuh_temporal_id_plus1(0), m_nalBuffer(nullptr), m_nalBufferLen(0) {}